

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O1

void __thiscall QMarkdownTextEdit::paintEvent(QMarkdownTextEdit *this,QPaintEvent *e)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  bool bVar5;
  QMarkdownTextEdit *pQVar6;
  char cVar7;
  byte bVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  QTextOption *pQVar12;
  bool bVar13;
  qreal extraout_RDX;
  bool bVar14;
  QPaintDevice *pQVar15;
  bool bVar16;
  double in_XMM1_Qa;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QColor QVar19;
  QPainter painter;
  QTextOption opt;
  QTextBlock block;
  QTextCursor cursor;
  QBrush brush;
  QPainterPath path;
  undefined1 local_140 [8];
  undefined1 local_138 [16];
  double local_128;
  double local_120;
  double local_118;
  QArrayData *local_110;
  int local_108;
  QMarkdownTextEdit *local_100;
  double local_f8;
  QTextCursor local_f0 [8];
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  QArrayData *local_c0 [3];
  double local_a8;
  double local_a0;
  QRectF local_98;
  double local_78;
  double local_70;
  double local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined2 local_54;
  QColor local_50;
  QArrayData *local_40 [2];
  
  local_98.w = (qreal)e;
  QPlainTextEdit::firstVisibleBlock();
  lVar11 = QAbstractScrollArea::viewport();
  pQVar15 = (QPaintDevice *)(lVar11 + 0x10);
  if (lVar11 == 0) {
    pQVar15 = (QPaintDevice *)0x0;
  }
  QPainter::QPainter((QPainter *)local_140,pQVar15);
  lVar11 = QAbstractScrollArea::viewport();
  lVar11 = *(long *)(lVar11 + 0x20);
  iVar10 = *(int *)(lVar11 + 0x1c);
  iVar1 = *(int *)(lVar11 + 0x14);
  iVar2 = *(int *)(lVar11 + 0x18);
  iVar3 = *(int *)(lVar11 + 0x20);
  local_78 = (double)QPlainTextEdit::contentOffset();
  local_d8 = 0.0;
  dStack_d0 = 0.0;
  local_e8 = 0.0;
  dStack_e0 = 0.0;
  local_138._0_4_ = 4;
  local_f8 = in_XMM1_Qa;
  QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
            (&MarkdownHighlighter::_formats,(HighlighterState *)local_138);
  QTextFormat::brushProperty((int)local_c0);
  cVar7 = QBrush::isOpaque();
  local_100 = this;
  if (cVar7 == '\0') {
    QColor::QColor((QColor *)local_138,transparent);
  }
  else {
    local_138._0_8_ = local_c0[0]->alloc;
    local_138._8_8_ = *(undefined8 *)(local_c0[0] + 1);
  }
  QBrush::~QBrush((QBrush *)local_c0);
  local_40[0] = (QArrayData *)local_138._0_8_;
  local_40[1]._0_4_ = (undefined4)local_138._8_8_;
  local_40[1]._4_2_ = SUB82(local_138._8_8_,4);
  local_a0 = (double)((iVar3 - iVar2) + 1);
  local_98.h = (qreal)((iVar10 - iVar1) + 1);
  bVar16 = true;
  bVar9 = false;
  local_118 = 0.0;
  bVar14 = false;
  bVar13 = false;
  bVar5 = false;
  while( true ) {
    cVar7 = QTextBlock::isValid();
    if ((cVar7 == '\0') || (bVar9)) break;
    QPlainTextEdit::blockBoundingRect((QTextBlock *)local_138);
    local_68 = (double)local_138._0_8_ + local_78;
    local_a8 = (double)local_138._8_8_ + local_f8;
    local_70 = local_128;
    local_c8 = local_120;
    iVar10 = QTextBlock::userState();
    if (bVar5) {
      if ((iVar10 == 100) || (iVar10 == 0x61)) {
        dStack_d0 = local_118;
        bVar14 = true;
        bVar5 = false;
      }
    }
    else if (((iVar10 - 4U < 2) || (iVar10 - 0x62U < 2)) || (199 < iVar10)) {
      QTextBlock::text();
      QVar17.m_data = (char *)0x3;
      QVar17.m_size = (qsizetype)local_138;
      cVar7 = QString::startsWith(QVar17,0x14b953);
      if (cVar7 == '\0') {
        QTextBlock::text();
        QVar18.m_data = (char *)0x3;
        QVar18.m_size = (qsizetype)local_c0;
        bVar8 = QString::startsWith(QVar18,0x14b957);
        bVar8 = bVar8 ^ 1;
        if (local_c0[0] != (QArrayData *)0x0) {
          LOCK();
          (local_c0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_c0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_c0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_c0[0],2,8);
          }
        }
      }
      else {
        bVar8 = 0;
      }
      if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_138._0_8_,2,8);
        }
      }
      if (bVar8 != 0) {
        local_e8 = local_68;
        dStack_e0 = local_a8;
        local_d8 = local_70;
        dStack_d0 = local_c8;
        bVar5 = true;
        local_118 = 0.0;
      }
      QTextBlock::previous();
      iVar10 = QTextBlock::userState();
      if (bVar16) {
        if ((iVar10 - 4U < 2) || (iVar10 - 0x62U < 2)) {
          bVar13 = true;
        }
        else if (199 < iVar10) {
          bVar13 = true;
        }
      }
    }
    if (bVar5) {
      QPlainTextEdit::document();
      QTextDocument::lastBlock();
      if ((local_110 == (QArrayData *)local_138._0_8_) && (local_108 == local_138._8_4_)) {
        local_118 = local_118 + local_c8;
        bVar14 = true;
        bVar5 = false;
        dStack_d0 = local_118;
      }
    }
    local_f8 = local_f8 + local_c8;
    local_118 = local_118 + local_c8;
    if ((local_a0 < local_f8) && (bVar9 = true, bVar5)) {
      bVar9 = true;
      bVar14 = true;
      dStack_d0 = local_118;
    }
    if ((local_a0 < local_f8) && (bVar9 = true, bVar5)) {
      bVar9 = true;
      bVar14 = true;
      dStack_d0 = local_118;
    }
    if (bVar14) {
      QPainter::setCompositionMode((CompositionMode)local_140);
      QPainter::setPen((PenStyle)local_140);
      QBrush::QBrush((QBrush *)local_138,(QColor *)local_40,SolidPattern);
      QPainter::setBrush((QBrush *)local_140);
      QBrush::~QBrush((QBrush *)local_138);
      if (bVar13) {
        QPainterPath::QPainterPath((QPainterPath *)&local_98);
        QPainterPath::setFillRule((FillRule)&local_98);
        QPainterPath::addRoundedRect(0,0x4014000000000000,&local_98,&local_e8,0);
        local_138._0_8_ = local_e8 + 0.0;
        local_138._8_8_ = dStack_e0 + 0.0;
        local_128 = local_d8 + 0.0;
        local_120 = dStack_d0 * -0.5 + dStack_d0;
        QPainterPath::addRect(&local_98);
        QPainterPath::simplified();
        QPainter::drawPath((QPainterPath *)local_140);
        QPainterPath::~QPainterPath((QPainterPath *)local_138);
        QPainterPath::~QPainterPath((QPainterPath *)&local_98);
        bVar14 = false;
        bVar13 = false;
      }
      else {
        bVar14 = false;
        QPainter::drawRoundedRect(local_140,&local_e8,0);
      }
    }
    QTextBlock::text();
    cVar7 = QString::isRightToLeft();
    if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_138._0_8_,2,8);
      }
    }
    if (cVar7 != '\0') {
      pQVar12 = (QTextOption *)QTextBlock::layout();
      QTextOption::QTextOption((QTextOption *)local_138,2);
      local_138._0_8_ = local_138._0_8_ & 0xffffffffffff3fff | 0x4000;
      QTextLayout::setTextOption(pQVar12);
      QTextOption::~QTextOption((QTextOption *)local_138);
    }
    pQVar6 = local_100;
    QPlainTextEdit::textCursor();
    if (pQVar6->_highlightCurrentLine == true) {
      QTextCursor::block();
      if (((QArrayData *)local_138._0_8_ == local_110) && (local_138._8_4_ == local_108)) {
        iVar10 = QTextBlock::layout();
        QTextCursor::positionInBlock();
        local_98.xp._0_4_ = QTextLayout::lineForTextPosition(iVar10);
        local_98.yp = extraout_RDX;
        QTextLine::rect();
        local_138._8_8_ = local_a8 + (double)local_138._8_8_;
        local_138._0_8_ = (0.0 - (double)local_138._0_8_) + (double)local_138._0_8_;
        local_128 = local_98.h - (double)local_138._0_8_;
        QVar19 = (QColor)QRectF::toAlignedRect();
        local_60 = *(undefined8 *)&local_100->_currentLineHighlightColor;
        uVar4 = *(undefined8 *)((long)&(local_100->_currentLineHighlightColor).ct + 4);
        local_58 = (undefined4)uVar4;
        local_54 = (undefined2)((ulong)uVar4 >> 0x20);
        local_50 = QVar19;
        QPainter::fillRect((QRect *)local_140,&local_50);
      }
    }
    QTextBlock::next();
    local_110 = (QArrayData *)local_138._0_8_;
    local_108 = local_138._8_4_;
    QTextCursor::~QTextCursor(local_f0);
    bVar16 = false;
  }
  QPainter::end();
  QPlainTextEdit::paintEvent((QPaintEvent *)local_100);
  QPainter::~QPainter((QPainter *)local_140);
  return;
}

Assistant:

void QMarkdownTextEdit::paintEvent(QPaintEvent *e) {
    QTextBlock block = firstVisibleBlock();

    QPainter painter(viewport());
    const QRect viewportRect = viewport()->rect();
    // painter.fillRect(viewportRect, Qt::transparent);
    bool firstVisible = true;
    QPointF offset(contentOffset());
    QRectF blockAreaRect;    // Code or block quote rect.
    bool inBlockArea = false;

    bool clipTop = false;
    bool drawBlock = false;
    qreal dy = 0.0;
    bool done = false;

    const QColor &color = MarkdownHighlighter::codeBlockBackgroundColor();
    const int cornerRadius = 5;

    while (block.isValid() && !done) {
        const QRectF r = blockBoundingRect(block).translated(offset);
        const int state = block.userState();

        if (!inBlockArea && MarkdownHighlighter::isCodeBlock(state)) {
            // skip the backticks
            if (!block.text().startsWith(QLatin1String("```")) &&
                !block.text().startsWith(QLatin1String("~~~"))) {
                blockAreaRect = r;
                dy = 0.0;
                inBlockArea = true;
            }

            // If this is the first visible block within the viewport
            // and if the previous block is part of the text block area,
            // then the rectangle to draw for the block area will have
            // its top clipped by the viewport and will need to be
            // drawn specially.
            const int prevBlockState = block.previous().userState();
            if (firstVisible &&
                MarkdownHighlighter::isCodeBlock(prevBlockState)) {
                clipTop = true;
            }
        }
        // Else if the block ends a text block area...
        else if (inBlockArea && MarkdownHighlighter::isCodeBlockEnd(state)) {
            drawBlock = true;
            inBlockArea = false;
            blockAreaRect.setHeight(dy);
        }
        // If the block is at the end of the document and ends a text
        // block area...
        //
        if (inBlockArea && block == this->document()->lastBlock()) {
            drawBlock = true;
            inBlockArea = false;
            dy += r.height();
            blockAreaRect.setHeight(dy);
        }
        offset.ry() += r.height();
        dy += r.height();

        // If this is the last text block visible within the viewport...
        if (offset.y() > viewportRect.height()) {
            if (inBlockArea) {
                blockAreaRect.setHeight(dy);
                drawBlock = true;
            }

            // Finished drawing.
            done = true;
        }
        // If this is the last text block visible within the viewport...
        if (offset.y() > viewportRect.height()) {
            if (inBlockArea) {
                blockAreaRect.setHeight(dy);
                drawBlock = true;
            }
            // Finished drawing.
            done = true;
        }

        if (drawBlock) {
            painter.setCompositionMode(QPainter::CompositionMode_SourceOver);
            painter.setPen(Qt::NoPen);
            painter.setBrush(QBrush(color));

            // If the first visible block is "clipped" such that the previous
            // block is part of the text block area, then only draw a rectangle
            // with the bottom corners rounded, and with the top corners square
            // to reflect that the first visible block is part of a larger block
            // of text.
            //
            if (clipTop) {
                QPainterPath path;
                path.setFillRule(Qt::WindingFill);
                path.addRoundedRect(blockAreaRect, cornerRadius, cornerRadius);
                qreal adjustedHeight = blockAreaRect.height() / 2;
                path.addRect(blockAreaRect.adjusted(0, 0, 0, -adjustedHeight));
                painter.drawPath(path.simplified());
                clipTop = false;
            }
            // Else draw the entire rectangle with all corners rounded.
            else {
                painter.drawRoundedRect(blockAreaRect, cornerRadius,
                                        cornerRadius);
            }

            drawBlock = false;
        }

        // this fixes the RTL bug of QPlainTextEdit
        // https://bugreports.qt.io/browse/QTBUG-7516
        if (block.text().isRightToLeft()) {
            QTextLayout *layout = block.layout();
            // opt = document()->defaultTextOption();
            QTextOption opt = QTextOption(Qt::AlignRight);
            opt.setTextDirection(Qt::RightToLeft);
            layout->setTextOption(opt);
        }

        // Current line highlight
        QTextCursor cursor = textCursor();
        if (highlightCurrentLine() && cursor.block() == block) {
            QTextLine line = block.layout()->lineForTextPosition(cursor.positionInBlock());
            QRectF lineRect = line.rect();
            lineRect.moveTop(lineRect.top() + r.top());
            lineRect.setLeft(0.);
            lineRect.setRight(viewportRect.width());
            painter.fillRect(lineRect.toAlignedRect(), currentLineHighlightColor());
        }

        block = block.next();
        firstVisible = false;
    }

    painter.end();
    QPlainTextEdit::paintEvent(e);
}